

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::web_peer_connection::handle_error(web_peer_connection *this,int bytes_left)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  alert_manager *paVar4;
  pointer __lhs;
  string *__rhs;
  error_category *cat;
  error_code local_d8;
  undefined1 local_c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  array<char,_22UL> local_96;
  undefined1 local_80 [8];
  string error_msg;
  string_view local_50;
  _Optional_payload_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> local_40;
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  int bytes_left_local;
  web_peer_connection *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = bytes_left;
  peer_connection::associated_torrent((peer_connection *)local_38);
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_28);
  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
            ((weak_ptr<libtorrent::aux::torrent> *)local_38);
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"retry-after");
  local_40 = (_Optional_payload_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>)
             http_parser::header_duration(&(this->super_web_connection_base).m_parser,local_50);
  torrent::retry_web_seed
            (peVar3,(peer_connection *)this,
             (optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>)local_40);
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  paVar4 = torrent::alerts(peVar3);
  bVar1 = alert_manager::should_post<libtorrent::url_seed_alert>(paVar4);
  if (bVar1) {
    iVar2 = http_parser::status_code(&(this->super_web_connection_base).m_parser);
    to_string(&local_96,(long)iVar2);
    __lhs = ::std::array<char,_22UL>::data((array<char,_22UL> *)&local_96);
    __rhs = http_parser::message_abi_cxx11_(&(this->super_web_connection_base).m_parser);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_c8 + 0x10)," ",__rhs);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     __lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_c8 + 0x10));
    ::std::__cxx11::string::~string((string *)(local_c8 + 0x10));
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    paVar4 = torrent::alerts(peVar3);
    ::std::__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
    torrent::get_handle((torrent *)local_c8);
    alert_manager::
    emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,std::__cxx11::string_const&>
              (paVar4,(torrent_handle *)local_c8,&this->m_url,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    torrent_handle::~torrent_handle((torrent_handle *)local_c8);
    ::std::__cxx11::string::~string((string *)local_80);
  }
  peer_connection::received_bytes
            ((peer_connection *)this,0,
             t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._4_4_);
  iVar2 = http_parser::status_code(&(this->super_web_connection_base).m_parser);
  cat = http_category();
  boost::system::error_code::error_code(&local_d8,iVar2,cat);
  (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
    _vptr_bandwidth_socket[0x14])(this,&local_d8,1,1);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_28);
  return;
}

Assistant:

void web_peer_connection::handle_error(int const bytes_left)
{
	auto t = associated_torrent().lock();
	TORRENT_ASSERT(t);

	// TODO: 2 just make this peer not have the pieces
	// associated with the file we just requested. Only
	// when it doesn't have any of the file do the following
	// pad files will make it complicated

	// temporarily unavailable, retry later
	t->retry_web_seed(this, m_parser.header_duration("retry-after"));
	if (t->alerts().should_post<url_seed_alert>())
	{
		std::string const error_msg = to_string(m_parser.status_code()).data()
			+ (" " + m_parser.message());
		t->alerts().emplace_alert<url_seed_alert>(t->get_handle(), m_url
			, error_msg);
	}
	received_bytes(0, bytes_left);
	disconnect(error_code(m_parser.status_code(), http_category()), operation_t::bittorrent, failure);
}